

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::param::Chart::evaluateOrthoQuality(Chart *this,UniformGrid2 *boundaryGrid)

{
  UniformGrid2 *boundaryGrid_local;
  Chart *this_local;
  
  Quality::computeBoundaryIntersection(&this->m_quality,this->m_unifiedMesh,boundaryGrid);
  Quality::computeFlippedFaces
            (&this->m_quality,this->m_unifiedMesh,this->m_initialFaceCount,
             (Array<unsigned_int> *)0x0);
  Quality::computeMetrics(&this->m_quality,this->m_unifiedMesh,this->m_initialFaceCount);
  if ((((((this->m_quality).boundaryIntersection & 1U) == 0) &&
       (0.0 < (this->m_quality).totalGeometricArea)) && ((this->m_quality).stretchMetric <= 1.1)) &&
     ((this->m_quality).maxStretchMetric <= 1.25)) {
    this->m_type = Ortho;
  }
  return;
}

Assistant:

void evaluateOrthoQuality(UniformGrid2 &boundaryGrid)
	{
		XA_PROFILE_START(parameterizeChartsEvaluateQuality)
		m_quality.computeBoundaryIntersection(m_unifiedMesh, boundaryGrid);
		m_quality.computeFlippedFaces(m_unifiedMesh, m_initialFaceCount, nullptr);
		m_quality.computeMetrics(m_unifiedMesh, m_initialFaceCount);
		XA_PROFILE_END(parameterizeChartsEvaluateQuality)
		// Use orthogonal parameterization if quality is acceptable.
		if (!m_quality.boundaryIntersection && m_quality.totalGeometricArea > 0.0f && m_quality.stretchMetric <= 1.1f && m_quality.maxStretchMetric <= 1.25f)
			m_type = ChartType::Ortho;
	}